

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTargetLinkLibrariesCommand.cxx
# Opt level: O0

bool __thiscall
anon_unknown.dwarf_968e7b::TLL::HandleLibrary
          (TLL *this,ProcessingState currentProcessingState,string *lib,cmTargetLinkLibraryType llt)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar1;
  cmMakefile *pcVar2;
  cmTarget *pcVar3;
  MessageType t;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  bool bVar5;
  TargetType TVar6;
  PolicyStatus PVar7;
  cmListFileContext *lfc;
  ostream *poVar8;
  string *psVar9;
  cmGlobalGenerator *this_00;
  size_type sVar10;
  cmake *this_01;
  PolicyID extraout_EDX;
  PolicyID id;
  PolicyID extraout_EDX_00;
  PolicyID extraout_EDX_01;
  PolicyID id_00;
  bool local_539;
  allocator<char> local_509;
  string local_508;
  cmValue local_4e8;
  string local_4e0;
  reference local_4c0;
  string *dc_1;
  iterator __end3_1;
  iterator __begin3_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range3_1;
  string local_498;
  string local_478;
  reference local_458;
  string *dc;
  iterator __end3;
  iterator __begin3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range3;
  string prop;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  debugConfigs;
  undefined1 local_3f8 [4];
  PolicyStatus policy22Status;
  allocator<char> local_3d1;
  string local_3d0;
  allocator<char> local_3a9;
  string local_3a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_388;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_368;
  undefined1 local_348 [8];
  string configLib;
  string local_308;
  allocator<char> local_2e1;
  string local_2e0;
  string local_2c0;
  cmTarget *local_2a0;
  cmTarget *tgt;
  int local_274;
  string local_270;
  char *local_250;
  char *existingSig;
  MessageType local_224;
  char *pcStack_220;
  MessageType messageType;
  char *modal;
  ostringstream e;
  undefined1 local_a0 [24];
  TLLSignature sig;
  allocator<char> local_51;
  string local_50;
  cmTargetLinkLibraryType local_2c;
  string *psStack_28;
  cmTargetLinkLibraryType llt_local;
  string *lib_local;
  TLL *pTStack_18;
  ProcessingState currentProcessingState_local;
  TLL *this_local;
  
  local_2c = llt;
  psStack_28 = lib;
  lib_local._4_4_ = currentProcessingState;
  pTStack_18 = this;
  TVar6 = cmTarget::GetType(this->Target);
  if ((TVar6 == INTERFACE_LIBRARY) && (lib_local._4_4_ != ProcessingKeywordLinkInterface)) {
    pcVar2 = this->Makefile;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,
               "INTERFACE library can only be used with the INTERFACE keyword of target_link_libraries"
               ,&local_51);
    cmMakefile::IssueMessage(pcVar2,FATAL_ERROR,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::allocator<char>::~allocator(&local_51);
    this_local._7_1_ = 0;
    goto LAB_0054e150;
  }
  bVar5 = cmTarget::IsImported(this->Target);
  if ((bVar5) && (lib_local._4_4_ != ProcessingKeywordLinkInterface)) {
    pcVar2 = this->Makefile;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&sig,
               "IMPORTED library can only be used with the INTERFACE keyword of target_link_libraries"
               ,(allocator<char> *)(local_a0 + 0x17));
    cmMakefile::IssueMessage(pcVar2,FATAL_ERROR,(string *)&sig);
    std::__cxx11::string::~string((string *)&sig);
    std::allocator<char>::~allocator((allocator<char> *)(local_a0 + 0x17));
    this_local._7_1_ = 0;
    goto LAB_0054e150;
  }
  local_539 = true;
  if ((((lib_local._4_4_ != ProcessingPlainPrivateInterface) &&
       (local_539 = true, lib_local._4_4_ != ProcessingPlainPublicInterface)) &&
      (local_539 = true, lib_local._4_4_ != ProcessingKeywordPrivateInterface)) &&
     (local_539 = true, lib_local._4_4_ != ProcessingKeywordPublicInterface)) {
    local_539 = lib_local._4_4_ == ProcessingKeywordLinkInterface;
  }
  pcVar3 = this->Target;
  local_a0._16_4_ = (byte)~local_539 & PlainTLLSignature;
  cmMakefile::GetBacktrace((cmMakefile *)local_a0);
  lfc = cmConstStack<cmListFileContext,_cmListFileBacktrace>::Top
                  ((cmConstStack<cmListFileContext,_cmListFileBacktrace> *)local_a0);
  bVar5 = cmTarget::PushTLLCommandTrace(pcVar3,(byte)~local_539 & PlainTLLSignature,lfc);
  cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_a0);
  id_00 = extraout_EDX;
  if (((bVar5 ^ 0xffU) & 1) != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&modal);
    pcStack_220 = (char *)0x0;
    local_224 = AUTHOR_WARNING;
    PVar7 = cmMakefile::GetPolicyStatus(this->Makefile,CMP0023,false);
    if (PVar7 != OLD) {
      if (PVar7 == WARN) {
        cmPolicies::GetPolicyWarning_abi_cxx11_((string *)&existingSig,(cmPolicies *)0x17,id);
        poVar8 = std::operator<<((ostream *)&modal,(string *)&existingSig);
        std::operator<<(poVar8,"\n");
        std::__cxx11::string::~string((string *)&existingSig);
        pcStack_220 = "should";
      }
      else if (PVar7 - NEW < 3) {
        pcStack_220 = "must";
        local_224 = FATAL_ERROR;
      }
    }
    if (pcStack_220 == (char *)0x0) {
LAB_0054d672:
      local_274 = 0;
    }
    else {
      local_250 = "keyword";
      if (local_a0._16_4_ == KeywordTLLSignature) {
        local_250 = "plain";
      }
      poVar8 = std::operator<<((ostream *)&modal,"The ");
      poVar8 = std::operator<<(poVar8,local_250);
      poVar8 = std::operator<<(poVar8,
                               " signature for target_link_libraries has already been used with the target \""
                              );
      psVar9 = cmTarget::GetName_abi_cxx11_(this->Target);
      poVar8 = std::operator<<(poVar8,(string *)psVar9);
      poVar8 = std::operator<<(poVar8,"\".  All uses of target_link_libraries with a target ");
      poVar8 = std::operator<<(poVar8,pcStack_220);
      std::operator<<(poVar8," be either all-keyword or all-plain.\n");
      cmTarget::GetTllSignatureTraces
                (this->Target,(ostream *)&modal,(uint)(local_a0._16_4_ == KeywordTLLSignature));
      t = local_224;
      pcVar2 = this->Makefile;
      std::__cxx11::ostringstream::str();
      cmMakefile::IssueMessage(pcVar2,t,&local_270);
      std::__cxx11::string::~string((string *)&local_270);
      if (local_224 != FATAL_ERROR) goto LAB_0054d672;
      this_local._7_1_ = 0;
      local_274 = 1;
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&modal);
    id_00 = extraout_EDX_00;
    if (local_274 != 0) goto LAB_0054e150;
  }
  pbVar4 = psStack_28;
  if ((lib_local._4_4_ != ProcessingKeywordLinkInterface) &&
     (lib_local._4_4_ != ProcessingPlainLinkInterface)) {
    if ((this->RejectRemoteLinking & 1U) != 0) {
      pcVar2 = this->Makefile;
      psVar9 = cmTarget::GetName_abi_cxx11_(this->Target);
      cmStrCat<char_const(&)[30],std::__cxx11::string_const&,char_const(&)[14],std::__cxx11::string_const&,char_const(&)[96]>
                ((string *)&tgt,(char (*) [30])"Attempt to add link library \"",pbVar4,
                 (char (*) [14])"\" to target \"",psVar9,
                 (char (*) [96])
                 "\" which is not built in this directory.\nThis is allowed only when policy CMP0079 is set to NEW."
                );
      cmMakefile::IssueMessage(pcVar2,FATAL_ERROR,(string *)&tgt);
      std::__cxx11::string::~string((string *)&tgt);
      this_local._7_1_ = 0;
      goto LAB_0054e150;
    }
    this_00 = cmMakefile::GetGlobalGenerator(this->Makefile);
    local_2a0 = cmGlobalGenerator::FindTarget(this_00,psStack_28,false);
    if ((((local_2a0 != (cmTarget *)0x0) &&
         (TVar6 = cmTarget::GetType(local_2a0), TVar6 != STATIC_LIBRARY)) &&
        ((TVar6 = cmTarget::GetType(local_2a0), TVar6 != SHARED_LIBRARY &&
         (((TVar6 = cmTarget::GetType(local_2a0), TVar6 != UNKNOWN_LIBRARY &&
           (TVar6 = cmTarget::GetType(local_2a0), TVar6 != OBJECT_LIBRARY)) &&
          (TVar6 = cmTarget::GetType(local_2a0), TVar6 != INTERFACE_LIBRARY)))))) &&
       (bVar5 = cmTarget::IsExecutableWithExports(local_2a0), pbVar4 = psStack_28, !bVar5)) {
      pcVar2 = this->Makefile;
      TVar6 = cmTarget::GetType(local_2a0);
      psVar9 = cmState::GetTargetTypeName_abi_cxx11_(TVar6);
      cmStrCat<char_const(&)[9],std::__cxx11::string_const&,char_const(&)[11],std::__cxx11::string_const&,char_const(&)[115],char_const(&)[50]>
                (&local_2c0,(char (*) [9])0xfe8cbd,pbVar4,(char (*) [11])"\" of type ",psVar9,
                 (char (*) [115])
                 " may not be linked into another target. One may link only to INTERFACE, OBJECT, STATIC or SHARED libraries, or to "
                 ,(char (*) [50])0x1012107);
      cmMakefile::IssueMessage(pcVar2,FATAL_ERROR,&local_2c0);
      std::__cxx11::string::~string((string *)&local_2c0);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2e0,"LINK_LIBRARIES",&local_2e1);
    AffectsProperty(this,&local_2e0);
    std::__cxx11::string::~string((string *)&local_2e0);
    std::allocator<char>::~allocator(&local_2e1);
    cmTarget::AddLinkLibrary(this->Target,this->Makefile,psStack_28,local_2c);
    id_00 = extraout_EDX_01;
  }
  if ((this->WarnRemoteInterface & 1U) != 0) {
    pcVar2 = this->Makefile;
    cmPolicies::GetPolicyWarning_abi_cxx11_
              ((string *)((long)&configLib.field_2 + 8),(cmPolicies *)0x4f,id_00);
    psVar9 = cmTarget::GetName_abi_cxx11_(this->Target);
    cmStrCat<std::__cxx11::string,char_const(&)[11],std::__cxx11::string_const&,char_const(&)[100],std::__cxx11::string_const&,char_const(&)[107]>
              (&local_308,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&configLib.field_2 + 8),(char (*) [11])"\nTarget\n  ",psVar9,
               (char (*) [100])
               "\nis not created in this directory.  For compatibility with older versions of CMake, link library\n  "
               ,psStack_28,
               (char (*) [107])
               "\nwill be looked up in the directory in which the target was created rather than in this calling directory."
              );
    cmMakefile::IssueMessage(pcVar2,AUTHOR_WARNING,&local_308);
    std::__cxx11::string::~string((string *)&local_308);
    std::__cxx11::string::~string((string *)(configLib.field_2._M_local_buf + 8));
  }
  if ((lib_local._4_4_ == ProcessingKeywordPrivateInterface) ||
     (lib_local._4_4_ == ProcessingPlainPrivateInterface)) {
    TVar6 = cmTarget::GetType(this->Target);
    if ((TVar6 == STATIC_LIBRARY) ||
       (TVar6 = cmTarget::GetType(this->Target), TVar6 == OBJECT_LIBRARY)) {
      cmTarget::GetDebugGeneratorExpressions((string *)local_348,this->Target,psStack_28,local_2c);
      bVar5 = cmGeneratorExpression::IsValidTargetName(psStack_28);
      if ((bVar5) ||
         (sVar10 = cmGeneratorExpression::Find(psStack_28), sVar10 != 0xffffffffffffffff)) {
        std::operator+(&local_388,"$<LINK_ONLY:",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_348);
        std::operator+(&local_368,&local_388,">");
        std::__cxx11::string::operator=((string *)local_348,(string *)&local_368);
        std::__cxx11::string::~string((string *)&local_368);
        std::__cxx11::string::~string((string *)&local_388);
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_3a8,"INTERFACE_LINK_LIBRARIES",&local_3a9);
      AppendProperty(this,&local_3a8,(string *)local_348);
      std::__cxx11::string::~string((string *)&local_3a8);
      std::allocator<char>::~allocator(&local_3a9);
      std::__cxx11::string::~string((string *)local_348);
    }
    this_local._7_1_ = 1;
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3d0,"INTERFACE_LINK_LIBRARIES",&local_3d1);
    cmTarget::GetDebugGeneratorExpressions((string *)local_3f8,this->Target,psStack_28,local_2c);
    AppendProperty(this,&local_3d0,(string *)local_3f8);
    std::__cxx11::string::~string((string *)local_3f8);
    std::__cxx11::string::~string((string *)&local_3d0);
    std::allocator<char>::~allocator(&local_3d1);
    if (lib_local._4_4_ == ProcessingLinkLibraries) {
      this_local._7_1_ = 1;
    }
    else {
      PVar7 = cmTarget::GetPolicyStatusCMP0022(this->Target);
      if ((PVar7 == OLD) || (PVar7 == WARN)) {
        TVar6 = cmTarget::GetType(this->Target);
        if (TVar6 == INTERFACE_LIBRARY) {
          this_local._7_1_ = 1;
        }
        else {
          this_01 = cmMakefile::GetCMakeInstance(this->Makefile);
          cmake::GetDebugConfigs_abi_cxx11_
                    ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)((long)&prop.field_2 + 8),this_01);
          std::__cxx11::string::string((string *)&__range3);
          if ((local_2c == DEBUG_LibraryType) || (local_2c == GENERAL_LibraryType)) {
            pvVar1 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)((long)&prop.field_2 + 8);
            __end3 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::begin(pvVar1);
            dc = (string *)
                 std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::end(pvVar1);
            while (bVar5 = __gnu_cxx::operator!=
                                     (&__end3,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                               *)&dc), bVar5) {
              local_458 = __gnu_cxx::
                          __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          ::operator*(&__end3);
              cmStrCat<char_const(&)[26],std::__cxx11::string_const&>
                        (&local_478,(char (*) [26])0x1033558,local_458);
              std::__cxx11::string::operator=((string *)&__range3,(string *)&local_478);
              std::__cxx11::string::~string((string *)&local_478);
              AppendProperty(this,(string *)&__range3,psStack_28);
              __gnu_cxx::
              __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator++(&__end3);
            }
          }
          if ((local_2c == OPTIMIZED_LibraryType) || (local_2c == GENERAL_LibraryType)) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_498,"LINK_INTERFACE_LIBRARIES",
                       (allocator<char> *)((long)&__range3_1 + 7));
            AppendProperty(this,&local_498,psStack_28);
            std::__cxx11::string::~string((string *)&local_498);
            std::allocator<char>::~allocator((allocator<char> *)((long)&__range3_1 + 7));
            pvVar1 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)((long)&prop.field_2 + 8);
            __end3_1 = std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::begin(pvVar1);
            dc_1 = (string *)
                   std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::end(pvVar1);
            while (bVar5 = __gnu_cxx::operator!=
                                     (&__end3_1,
                                      (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)&dc_1), bVar5) {
              local_4c0 = __gnu_cxx::
                          __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          ::operator*(&__end3_1);
              cmStrCat<char_const(&)[26],std::__cxx11::string_const&>
                        (&local_4e0,(char (*) [26])0x1033558,local_4c0);
              std::__cxx11::string::operator=((string *)&__range3,(string *)&local_4e0);
              std::__cxx11::string::~string((string *)&local_4e0);
              local_4e8 = cmTarget::GetProperty(this->Target,(string *)&__range3);
              bVar5 = cmValue::operator_cast_to_bool(&local_4e8);
              if (((bVar5 ^ 0xffU) & 1) != 0) {
                pcVar3 = this->Target;
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_508,"",&local_509);
                cmTarget::SetProperty(pcVar3,(string *)&__range3,&local_508);
                std::__cxx11::string::~string((string *)&local_508);
                std::allocator<char>::~allocator(&local_509);
              }
              __gnu_cxx::
              __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator++(&__end3_1);
            }
          }
          std::__cxx11::string::~string((string *)&__range3);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)((long)&prop.field_2 + 8));
          this_local._7_1_ = 1;
        }
      }
      else {
        this_local._7_1_ = 1;
      }
    }
  }
LAB_0054e150:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool TLL::HandleLibrary(ProcessingState currentProcessingState,
                        const std::string& lib, cmTargetLinkLibraryType llt)
{
  if (this->Target->GetType() == cmStateEnums::INTERFACE_LIBRARY &&
      currentProcessingState != ProcessingKeywordLinkInterface) {
    this->Makefile.IssueMessage(
      MessageType::FATAL_ERROR,
      "INTERFACE library can only be used with the INTERFACE keyword of "
      "target_link_libraries");
    return false;
  }
  if (this->Target->IsImported() &&
      currentProcessingState != ProcessingKeywordLinkInterface) {
    this->Makefile.IssueMessage(
      MessageType::FATAL_ERROR,
      "IMPORTED library can only be used with the INTERFACE keyword of "
      "target_link_libraries");
    return false;
  }

  cmTarget::TLLSignature sig =
    (currentProcessingState == ProcessingPlainPrivateInterface ||
     currentProcessingState == ProcessingPlainPublicInterface ||
     currentProcessingState == ProcessingKeywordPrivateInterface ||
     currentProcessingState == ProcessingKeywordPublicInterface ||
     currentProcessingState == ProcessingKeywordLinkInterface)
    ? cmTarget::KeywordTLLSignature
    : cmTarget::PlainTLLSignature;
  if (!this->Target->PushTLLCommandTrace(
        sig, this->Makefile.GetBacktrace().Top())) {
    std::ostringstream e;
    const char* modal = nullptr;
    MessageType messageType = MessageType::AUTHOR_WARNING;
    switch (this->Makefile.GetPolicyStatus(cmPolicies::CMP0023)) {
      case cmPolicies::WARN:
        e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0023) << "\n";
        modal = "should";
        CM_FALLTHROUGH;
      case cmPolicies::OLD:
        break;
      case cmPolicies::REQUIRED_ALWAYS:
      case cmPolicies::REQUIRED_IF_USED:
      case cmPolicies::NEW:
        modal = "must";
        messageType = MessageType::FATAL_ERROR;
        break;
    }

    if (modal) {
      // If the sig is a keyword form and there is a conflict, the existing
      // form must be the plain form.
      const char* existingSig =
        (sig == cmTarget::KeywordTLLSignature ? "plain" : "keyword");
      e << "The " << existingSig
        << " signature for target_link_libraries has "
           "already been used with the target \""
        << this->Target->GetName()
        << "\".  All uses of target_link_libraries with a target " << modal
        << " be either all-keyword or all-plain.\n";
      this->Target->GetTllSignatureTraces(e,
                                          sig == cmTarget::KeywordTLLSignature
                                            ? cmTarget::PlainTLLSignature
                                            : cmTarget::KeywordTLLSignature);
      this->Makefile.IssueMessage(messageType, e.str());
      if (messageType == MessageType::FATAL_ERROR) {
        return false;
      }
    }
  }

  // Handle normal case where the command was called with another keyword than
  // INTERFACE / LINK_INTERFACE_LIBRARIES or none at all. (The "LINK_LIBRARIES"
  // property of the target on the LHS shall be populated.)
  if (currentProcessingState != ProcessingKeywordLinkInterface &&
      currentProcessingState != ProcessingPlainLinkInterface) {

    if (this->RejectRemoteLinking) {
      this->Makefile.IssueMessage(
        MessageType::FATAL_ERROR,
        cmStrCat("Attempt to add link library \"", lib, "\" to target \"",
                 this->Target->GetName(),
                 "\" which is not built in this "
                 "directory.\nThis is allowed only when policy CMP0079 "
                 "is set to NEW."));
      return false;
    }

    cmTarget* tgt = this->Makefile.GetGlobalGenerator()->FindTarget(lib);

    if (tgt && (tgt->GetType() != cmStateEnums::STATIC_LIBRARY) &&
        (tgt->GetType() != cmStateEnums::SHARED_LIBRARY) &&
        (tgt->GetType() != cmStateEnums::UNKNOWN_LIBRARY) &&
        (tgt->GetType() != cmStateEnums::OBJECT_LIBRARY) &&
        (tgt->GetType() != cmStateEnums::INTERFACE_LIBRARY) &&
        !tgt->IsExecutableWithExports()) {
      this->Makefile.IssueMessage(
        MessageType::FATAL_ERROR,
        cmStrCat(
          "Target \"", lib, "\" of type ",
          cmState::GetTargetTypeName(tgt->GetType()),
          " may not be linked into another target. One may link only to "
          "INTERFACE, OBJECT, STATIC or SHARED libraries, or to ",
          "executables with the ENABLE_EXPORTS property set."));
    }

    this->AffectsProperty("LINK_LIBRARIES");
    this->Target->AddLinkLibrary(this->Makefile, lib, llt);
  }

  if (this->WarnRemoteInterface) {
    this->Makefile.IssueMessage(
      MessageType::AUTHOR_WARNING,
      cmStrCat(
        cmPolicies::GetPolicyWarning(cmPolicies::CMP0079), "\nTarget\n  ",
        this->Target->GetName(),
        "\nis not created in this "
        "directory.  For compatibility with older versions of CMake, link "
        "library\n  ",
        lib,
        "\nwill be looked up in the directory in which "
        "the target was created rather than in this calling directory."));
  }

  // Handle (additional) case where the command was called with PRIVATE /
  // LINK_PRIVATE and stop its processing. (The "INTERFACE_LINK_LIBRARIES"
  // property of the target on the LHS shall only be populated if it is a
  // STATIC library.)
  if (currentProcessingState == ProcessingKeywordPrivateInterface ||
      currentProcessingState == ProcessingPlainPrivateInterface) {
    if (this->Target->GetType() == cmStateEnums::STATIC_LIBRARY ||
        this->Target->GetType() == cmStateEnums::OBJECT_LIBRARY) {
      // TODO: Detect and no-op `$<COMPILE_ONLY>` genexes here.
      std::string configLib =
        this->Target->GetDebugGeneratorExpressions(lib, llt);
      if (cmGeneratorExpression::IsValidTargetName(lib) ||
          cmGeneratorExpression::Find(lib) != std::string::npos) {
        configLib = "$<LINK_ONLY:" + configLib + ">";
      }
      this->AppendProperty("INTERFACE_LINK_LIBRARIES", configLib);
    }
    return true;
  }

  // Handle general case where the command was called with another keyword than
  // PRIVATE / LINK_PRIVATE or none at all. (The "INTERFACE_LINK_LIBRARIES"
  // property of the target on the LHS shall be populated.)
  this->AppendProperty("INTERFACE_LINK_LIBRARIES",
                       this->Target->GetDebugGeneratorExpressions(lib, llt));

  // Stop processing if called without any keyword.
  if (currentProcessingState == ProcessingLinkLibraries) {
    return true;
  }
  // Stop processing if policy CMP0022 is set to NEW.
  const cmPolicies::PolicyStatus policy22Status =
    this->Target->GetPolicyStatusCMP0022();
  if (policy22Status != cmPolicies::OLD &&
      policy22Status != cmPolicies::WARN) {
    return true;
  }
  // Stop processing if called with an INTERFACE library on the LHS.
  if (this->Target->GetType() == cmStateEnums::INTERFACE_LIBRARY) {
    return true;
  }

  // Handle (additional) backward-compatibility case where the command was
  // called with PUBLIC / INTERFACE / LINK_PUBLIC / LINK_INTERFACE_LIBRARIES.
  // (The policy CMP0022 is not set to NEW.)
  {
    // Get the list of configurations considered to be DEBUG.
    std::vector<std::string> debugConfigs =
      this->Makefile.GetCMakeInstance()->GetDebugConfigs();
    std::string prop;

    // Include this library in the link interface for the target.
    if (llt == DEBUG_LibraryType || llt == GENERAL_LibraryType) {
      // Put in the DEBUG configuration interfaces.
      for (std::string const& dc : debugConfigs) {
        prop = cmStrCat("LINK_INTERFACE_LIBRARIES_", dc);
        this->AppendProperty(prop, lib);
      }
    }
    if (llt == OPTIMIZED_LibraryType || llt == GENERAL_LibraryType) {
      // Put in the non-DEBUG configuration interfaces.
      this->AppendProperty("LINK_INTERFACE_LIBRARIES", lib);

      // Make sure the DEBUG configuration interfaces exist so that the
      // general one will not be used as a fall-back.
      for (std::string const& dc : debugConfigs) {
        prop = cmStrCat("LINK_INTERFACE_LIBRARIES_", dc);
        if (!this->Target->GetProperty(prop)) {
          this->Target->SetProperty(prop, "");
        }
      }
    }
  }
  return true;
}